

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.cpp
# Opt level: O2

void alListenerf(ALenum param,ALfloat value)

{
  mutex *__mutex;
  intrusive_ptr<ALCcontext> iVar1;
  char *msg;
  ALenum errorCode;
  ContextRef context;
  intrusive_ptr<ALCcontext> local_28;
  ALfloat local_1c;
  
  local_1c = value;
  GetContextRef();
  iVar1.mPtr = local_28.mPtr;
  if (local_28.mPtr == (ALCcontext *)0x0) goto LAB_0011f09b;
  __mutex = &(local_28.mPtr)->mPropLock;
  std::mutex::lock(__mutex);
  if (param == 0x100a) {
    if ((0x7effffff < (int)ABS(local_1c) - 0x800000U || (int)local_1c < 0) &&
        (ABS(local_1c) != 0.0 && 0x7ffffe < (int)local_1c - 1U)) {
      msg = "Listener gain out of range";
      errorCode = 0xa003;
      goto LAB_0011f088;
    }
    ((iVar1.mPtr)->mListener).Gain = local_1c;
LAB_0011f056:
    if ((((local_28.mPtr)->mDeferUpdates)._M_base._M_i & 1U) == 0) {
      UpdateListenerProps(local_28.mPtr);
    }
    else {
      ((iVar1.mPtr)->mListener).PropsClean.super___atomic_flag_base._M_i = false;
    }
  }
  else {
    if (param == 0x20004) {
      msg = "Listener meters per unit out of range";
      errorCode = 0xa003;
      if ((1.1754944e-38 <= local_1c) && (local_1c <= 3.4028235e+38)) {
        ((iVar1.mPtr)->mListener).mMetersPerUnit = local_1c;
        goto LAB_0011f056;
      }
    }
    else {
      msg = "Invalid listener float property";
      errorCode = 0xa002;
    }
LAB_0011f088:
    ALCcontext::setError(local_28.mPtr,errorCode,msg);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_0011f09b:
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr(&local_28);
  return;
}

Assistant:

AL_API void AL_APIENTRY alListenerf(ALenum param, ALfloat value)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    ALlistener &listener = context->mListener;
    std::lock_guard<std::mutex> _{context->mPropLock};
    switch(param)
    {
    case AL_GAIN:
        if(!(value >= 0.0f && std::isfinite(value)))
            SETERR_RETURN(context, AL_INVALID_VALUE,, "Listener gain out of range");
        listener.Gain = value;
        DO_UPDATEPROPS();
        break;

    case AL_METERS_PER_UNIT:
        if(!(value >= AL_MIN_METERS_PER_UNIT && value <= AL_MAX_METERS_PER_UNIT))
            SETERR_RETURN(context, AL_INVALID_VALUE,, "Listener meters per unit out of range");
        listener.mMetersPerUnit = value;
        DO_UPDATEPROPS();
        break;

    default:
        context->setError(AL_INVALID_ENUM, "Invalid listener float property");
    }
}